

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef
ConvertToDataType(LlvmCompilationContext *ctx,LLVMValueRef value,TypeBase *valueType,
                 TypeBase *targetType)

{
  ExpressionContext *pEVar1;
  
  if ((targetType != valueType) &&
     (((pEVar1 = ctx->ctx, pEVar1->typeInt == valueType &&
       (((pEVar1->typeBool == targetType || (pEVar1->typeChar == targetType)) ||
        (pEVar1->typeShort == targetType)))) ||
      ((pEVar1->typeDouble == valueType && (pEVar1->typeFloat == targetType)))))) {
    CompileLlvmType(ctx,targetType);
    return (LLVMValueRef)&placeholderValue;
  }
  return value;
}

Assistant:

LLVMValueRef ConvertToDataType(LlvmCompilationContext &ctx, LLVMValueRef value, TypeBase *valueType, TypeBase *targetType)
{
	if(targetType == valueType)
		return value;

	if(valueType == ctx.ctx.typeInt)
	{
		if(targetType == ctx.ctx.typeBool)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");

		if(targetType == ctx.ctx.typeChar)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");

		if(targetType == ctx.ctx.typeShort)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");
	}

	if(valueType == ctx.ctx.typeDouble)
	{
		if(targetType == ctx.ctx.typeFloat)
			return LLVMBuildFPCast(ctx.builder, value, CompileLlvmType(ctx, targetType), "");
	}

	return value;
}